

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

void __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::pop
          (iterator *this)

{
  bool bVar1;
  byte bVar2;
  stack_entry *psVar3;
  key_prefix_size prefix_len;
  iterator *this_local;
  
  bVar1 = empty(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0x1dd,
                  "void unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::pop() [Key = unsigned long, Value = std::span<const std::byte>]"
                 );
  }
  psVar3 = top(this);
  bVar2 = detail::key_prefix_snapshot::length
                    ((key_prefix_snapshot *)&(psVar3->super_iter_result).prefix.f);
  detail::key_buffer::pop(&this->keybuf_,(ulong)bVar2);
  std::
  stack<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::deque<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>_>
  ::pop(&this->stack_);
  return;
}

Assistant:

void pop() noexcept {
      UNODB_DETAIL_ASSERT(!empty());

      // Note: We DO NOT need to check the RCS here. The prefix_len
      // on the stack is known to be valid at the time that the entry
      // was pushed onto the stack and the stack and the keybuf are in
      // sync with one another.  So we can just do a simple POP for
      // each of them.
      const auto prefix_len = top().prefix.length();
      keybuf_.pop(prefix_len);
      stack_.pop();
    }